

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cDrawIndirectTests.cpp
# Opt level: O0

long __thiscall
glcts::anon_unknown_0::CBasicVertexDef::Run<glcts::(anonymous_namespace)::test_api::GL>
          (CBasicVertexDef *this)

{
  allocator<tcu::Vector<float,_4>_> *paVar1;
  GLuint GVar2;
  int iVar3;
  int iVar4;
  uint widthTest;
  uint heightTest;
  uint widthRef;
  uint heightRef;
  size_type sVar5;
  reference pvVar6;
  reference pvVar7;
  runtime_error *this_00;
  long _code;
  DILogger local_480;
  undefined1 local_300 [8];
  DIResult result;
  Vector<float,_4> local_170;
  undefined1 local_160 [8];
  CColorArray bufferTest;
  Vector<float,_4> local_140;
  undefined1 local_130 [8];
  CColorArray bufferRef;
  GLuint buffer_1;
  GLuint buffer;
  size_t i;
  undefined1 local_100 [8];
  CElementArray elements;
  DrawElementsIndirectCommand indirectElements;
  undefined8 uStack_c8;
  DrawArraysIndirectCommand indirectArrays;
  string local_a8;
  allocator<char> local_81;
  string local_80;
  string local_60;
  undefined1 local_30 [8];
  CColorArray coords;
  CBasicVertexDef *this_local;
  
  coords.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)this;
  std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::vector
            ((vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *)local_30);
  DrawIndirectBase::PrimitiveGen
            (&this->super_DrawIndirectBase,this->_primitiveType,this->_drawSizeX,this->_drawSizeY,
             (vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *)local_30);
  anon_unknown_0::shaders::vshSimple<glcts::(anonymous_namespace)::test_api::GL>();
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_80,"",&local_81);
  anon_unknown_0::shaders::fshSimple<glcts::(anonymous_namespace)::test_api::GL>();
  GVar2 = DrawIndirectBase::CreateProgram
                    (&this->super_DrawIndirectBase,&local_60,&local_80,&local_a8,true);
  this->_program = GVar2;
  std::__cxx11::string::~string((string *)&local_a8);
  std::__cxx11::string::~string((string *)&local_80);
  std::allocator<char>::~allocator(&local_81);
  std::__cxx11::string::~string((string *)&local_60);
  if (this->_program == 0) {
    this_local = (CBasicVertexDef *)&DAT_ffffffffffffffff;
  }
  else {
    glu::CallLogWrapper::glUseProgram
              (&(this->super_DrawIndirectBase).super_SubcaseBase.super_GLWrapper.
                super_CallLogWrapper,this->_program);
    glu::CallLogWrapper::glGenBuffers
              (&(this->super_DrawIndirectBase).super_SubcaseBase.super_GLWrapper.
                super_CallLogWrapper,1,&this->_vbo);
    glu::CallLogWrapper::glBindBuffer
              (&(this->super_DrawIndirectBase).super_SubcaseBase.super_GLWrapper.
                super_CallLogWrapper,0x8892,this->_vbo);
    sVar5 = std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::size
                      ((vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *)
                       local_30);
    pvVar6 = std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::operator[]
                       ((vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *)
                        local_30,0);
    glu::CallLogWrapper::glBufferData
              (&(this->super_DrawIndirectBase).super_SubcaseBase.super_GLWrapper.
                super_CallLogWrapper,0x8892,sVar5 << 4,pvVar6,0x88e4);
    glu::CallLogWrapper::glGenVertexArrays
              (&(this->super_DrawIndirectBase).super_SubcaseBase.super_GLWrapper.
                super_CallLogWrapper,1,&this->_vao);
    glu::CallLogWrapper::glBindVertexArray
              (&(this->super_DrawIndirectBase).super_SubcaseBase.super_GLWrapper.
                super_CallLogWrapper,this->_vao);
    glu::CallLogWrapper::glVertexAttribPointer
              (&(this->super_DrawIndirectBase).super_SubcaseBase.super_GLWrapper.
                super_CallLogWrapper,0,4,0x1406,'\0',0x10,(void *)0x0);
    glu::CallLogWrapper::glEnableVertexAttribArray
              (&(this->super_DrawIndirectBase).super_SubcaseBase.super_GLWrapper.
                super_CallLogWrapper,0);
    uStack_c8 = 0;
    indirectArrays.count = 0;
    indirectArrays.primCount = 0;
    elements.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    sVar5 = std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::size
                      ((vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *)
                       local_30);
    i._4_4_ = 0;
    std::allocator<unsigned_int>::allocator((allocator<unsigned_int> *)((long)&i + 3));
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_100,sVar5,
               (value_type_conflict4 *)((long)&i + 4),(allocator<unsigned_int> *)((long)&i + 3));
    std::allocator<unsigned_int>::~allocator((allocator<unsigned_int> *)((long)&i + 3));
    _buffer_1 = 0;
    while( true ) {
      sVar5 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size
                        ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_100);
      if (sVar5 <= _buffer_1) break;
      pvVar7 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                         ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_100,_buffer_1
                         );
      *pvVar7 = (value_type)_buffer_1;
      _buffer_1 = _buffer_1 + 1;
    }
    if (this->_drawFunc == DRAW_ARRAYS) {
      sVar5 = std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::size
                        ((vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *)
                         local_30);
      uStack_c8 = CONCAT44(1,(int)sVar5);
      indirectArrays.count = 0;
      indirectArrays.primCount = 0;
      glu::CallLogWrapper::glGenBuffers
                (&(this->super_DrawIndirectBase).super_SubcaseBase.super_GLWrapper.
                  super_CallLogWrapper,1,
                 (GLuint *)
                 ((long)&bufferRef.
                         super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage + 4));
      glu::CallLogWrapper::glBindBuffer
                (&(this->super_DrawIndirectBase).super_SubcaseBase.super_GLWrapper.
                  super_CallLogWrapper,0x8f3f,
                 bufferRef.
                 super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
                 _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_);
      glu::CallLogWrapper::glBufferData
                (&(this->super_DrawIndirectBase).super_SubcaseBase.super_GLWrapper.
                  super_CallLogWrapper,0x8f3f,0x10,&uStack_c8,0x88e4);
      glu::CallLogWrapper::glDrawArraysIndirect
                (&(this->super_DrawIndirectBase).super_SubcaseBase.super_GLWrapper.
                  super_CallLogWrapper,this->_primitiveType,(void *)0x0);
      glu::CallLogWrapper::glDeleteBuffers
                (&(this->super_DrawIndirectBase).super_SubcaseBase.super_GLWrapper.
                  super_CallLogWrapper,1,
                 (GLuint *)
                 ((long)&bufferRef.
                         super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage + 4));
    }
    else {
      if (this->_drawFunc != DRAW_ELEMENTS) {
        this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::runtime_error::runtime_error(this_00,"Unknown draw function!");
        __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
      sVar5 = std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::size
                        ((vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *)
                         local_30);
      elements.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)CONCAT44(1,(int)sVar5);
      glu::CallLogWrapper::glGenBuffers
                (&(this->super_DrawIndirectBase).super_SubcaseBase.super_GLWrapper.
                  super_CallLogWrapper,1,&this->_ebo);
      glu::CallLogWrapper::glBindBuffer
                (&(this->super_DrawIndirectBase).super_SubcaseBase.super_GLWrapper.
                  super_CallLogWrapper,0x8893,this->_ebo);
      sVar5 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size
                        ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_100);
      pvVar7 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                         ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_100,0);
      glu::CallLogWrapper::glBufferData
                (&(this->super_DrawIndirectBase).super_SubcaseBase.super_GLWrapper.
                  super_CallLogWrapper,0x8893,sVar5 << 2,pvVar7,0x88e4);
      glu::CallLogWrapper::glGenBuffers
                (&(this->super_DrawIndirectBase).super_SubcaseBase.super_GLWrapper.
                  super_CallLogWrapper,1,
                 (GLuint *)
                 &bufferRef.
                  super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage);
      glu::CallLogWrapper::glBindBuffer
                (&(this->super_DrawIndirectBase).super_SubcaseBase.super_GLWrapper.
                  super_CallLogWrapper,0x8f3f,
                 (GLuint)bufferRef.
                         super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage);
      glu::CallLogWrapper::glBufferData
                (&(this->super_DrawIndirectBase).super_SubcaseBase.super_GLWrapper.
                  super_CallLogWrapper,0x8f3f,0x14,
                 &elements.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage,0x88e4);
      glu::CallLogWrapper::glDrawElementsIndirect
                (&(this->super_DrawIndirectBase).super_SubcaseBase.super_GLWrapper.
                  super_CallLogWrapper,this->_primitiveType,0x1405,(void *)0x0);
      glu::CallLogWrapper::glDeleteBuffers
                (&(this->super_DrawIndirectBase).super_SubcaseBase.super_GLWrapper.
                  super_CallLogWrapper,1,
                 (GLuint *)
                 &bufferRef.
                  super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage);
    }
    iVar3 = DrawIndirectBase::getWindowWidth(&this->super_DrawIndirectBase);
    iVar4 = DrawIndirectBase::getWindowHeight(&this->super_DrawIndirectBase);
    tcu::Vector<float,_4>::Vector(&local_140,0.1,0.2,0.3,1.0);
    paVar1 = (allocator<tcu::Vector<float,_4>_> *)
             ((long)&bufferTest.
                     super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage + 7);
    std::allocator<tcu::Vector<float,_4>_>::allocator(paVar1);
    std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::vector
              ((vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *)local_130,
               (long)(iVar3 * iVar4),&local_140,paVar1);
    std::allocator<tcu::Vector<float,_4>_>::~allocator
              ((allocator<tcu::Vector<float,_4>_> *)
               ((long)&bufferTest.
                       super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
    iVar3 = DrawIndirectBase::getWindowWidth(&this->super_DrawIndirectBase);
    iVar4 = DrawIndirectBase::getWindowHeight(&this->super_DrawIndirectBase);
    tcu::Vector<float,_4>::Vector(&local_170,0.0);
    paVar1 = (allocator<tcu::Vector<float,_4>_> *)((long)&result.status_ + 7);
    std::allocator<tcu::Vector<float,_4>_>::allocator(paVar1);
    std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::vector
              ((vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *)local_160,
               (long)(iVar3 * iVar4),&local_170,paVar1);
    std::allocator<tcu::Vector<float,_4>_>::~allocator
              ((allocator<tcu::Vector<float,_4>_> *)((long)&result.status_ + 7));
    iVar3 = DrawIndirectBase::getWindowWidth(&this->super_DrawIndirectBase);
    iVar4 = DrawIndirectBase::getWindowHeight(&this->super_DrawIndirectBase);
    pvVar6 = std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::operator[]
                       ((vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *)
                        local_160,0);
    DrawIndirectBase::ReadPixelsFloat<glcts::(anonymous_namespace)::test_api::GL>
              (&this->super_DrawIndirectBase,0,0,iVar3,iVar4,pvVar6);
    DIResult::DIResult((DIResult *)local_300);
    widthTest = DrawIndirectBase::getWindowWidth(&this->super_DrawIndirectBase);
    heightTest = DrawIndirectBase::getWindowHeight(&this->super_DrawIndirectBase);
    widthRef = DrawIndirectBase::getWindowWidth(&this->super_DrawIndirectBase);
    heightRef = DrawIndirectBase::getWindowHeight(&this->super_DrawIndirectBase);
    _code = glcts::(anonymous_namespace)::DrawIndirectBase::BuffersCompare<tcu::Vector<float,4>>
                      ((DrawIndirectBase *)this,
                       (vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *)
                       local_160,widthTest,heightTest,
                       (vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *)
                       local_130,widthRef,heightRef);
    DIResult::sub_result(&local_480,(DIResult *)local_300,_code);
    DILogger::~DILogger(&local_480);
    this_local = (CBasicVertexDef *)DIResult::code((DIResult *)local_300);
    DIResult::~DIResult((DIResult *)local_300);
    std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::~vector
              ((vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *)local_160);
    std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::~vector
              ((vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *)local_130);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_100);
  }
  std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::~vector
            ((vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *)local_30);
  return (long)this_local;
}

Assistant:

long Run()
	{
		CColorArray coords;
		PrimitiveGen(_primitiveType, _drawSizeX, _drawSizeY, coords);

		_program = CreateProgram(shaders::vshSimple<api>(), "", shaders::fshSimple<api>(), true);
		if (!_program)
		{
			return ERROR;
		}
		glUseProgram(_program);

		glGenBuffers(1, &_vbo);
		glBindBuffer(GL_ARRAY_BUFFER, _vbo);
		glBufferData(GL_ARRAY_BUFFER, (GLsizeiptr)(coords.size() * sizeof(coords[0])), &coords[0], GL_STATIC_DRAW);

		glGenVertexArrays(1, &_vao);
		glBindVertexArray(_vao);
		glVertexAttribPointer(0, 4, GL_FLOAT, GL_FALSE, sizeof(coords[0]), 0);
		glEnableVertexAttribArray(0);

		DrawArraysIndirectCommand   indirectArrays   = { 0, 0, 0, 0 };
		DrawElementsIndirectCommand indirectElements = { 0, 0, 0, 0, 0 };

		CElementArray elements(coords.size(), 0);
		for (size_t i = 0; i < elements.size(); ++i)
		{
			elements[i] = static_cast<GLuint>(i);
		}

		switch (_drawFunc)
		{
		case DRAW_ARRAYS:
		{
			indirectArrays.count			  = static_cast<GLuint>(coords.size());
			indirectArrays.primCount		  = 1;
			indirectArrays.first			  = 0;
			indirectArrays.reservedMustBeZero = 0;

			{
				GLuint buffer;
				glGenBuffers(1, &buffer);
				glBindBuffer(GL_DRAW_INDIRECT_BUFFER, buffer);
				glBufferData(GL_DRAW_INDIRECT_BUFFER, sizeof(indirectArrays), &indirectArrays, GL_STATIC_DRAW);
				glDrawArraysIndirect(_primitiveType, 0);
				glDeleteBuffers(1, &buffer);
			}
		}
		break;
		case DRAW_ELEMENTS:
		{
			indirectElements.count				= static_cast<GLuint>(coords.size());
			indirectElements.primCount			= 1;
			indirectElements.firstIndex			= 0;
			indirectElements.baseVertex			= 0;
			indirectElements.reservedMustBeZero = 0;

			glGenBuffers(1, &_ebo);
			glBindBuffer(GL_ELEMENT_ARRAY_BUFFER, _ebo);
			glBufferData(GL_ELEMENT_ARRAY_BUFFER, (GLsizeiptr)(elements.size() * sizeof(elements[0])), &elements[0],
						 GL_STATIC_DRAW);

			{
				GLuint buffer;
				glGenBuffers(1, &buffer);
				glBindBuffer(GL_DRAW_INDIRECT_BUFFER, buffer);
				glBufferData(GL_DRAW_INDIRECT_BUFFER, sizeof(indirectElements), &indirectElements, GL_STATIC_DRAW);
				glDrawElementsIndirect(_primitiveType, GL_UNSIGNED_INT, 0);
				glDeleteBuffers(1, &buffer);
			}
		}
		break;
		default:
			throw std::runtime_error("Unknown draw function!");
			break;
		}

		CColorArray bufferRef(getWindowWidth() * getWindowHeight(), tcu::Vec4(0.1f, 0.2f, 0.3f, 1.0f));
		CColorArray bufferTest(getWindowWidth() * getWindowHeight(), tcu::Vec4(0.0f));
		ReadPixelsFloat<api>(0, 0, getWindowWidth(), getWindowHeight(), &bufferTest[0]);

		DIResult result;
		result.sub_result(BuffersCompare(bufferTest, getWindowWidth(), getWindowHeight(), bufferRef, getWindowWidth(),
										 getWindowHeight()));

		return result.code();
	}